

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O1

void __thiscall
MonahanPlanner::CheckMaxNrVectors(MonahanPlanner *this,size_t maxNrAlphas,size_t nrAlphas)

{
  ostream *poVar1;
  undefined8 *puVar2;
  stringstream ss;
  long local_1c8;
  long local_1c0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (nrAlphas <= maxNrAlphas || maxNrAlphas == 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"MonahanPlanner::CheckMaxNrVectors too many alpha vectors ",0x39);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar2 = &PTR__E_0059bd80;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_1c8,local_1c0 + local_1c8);
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

void MonahanPlanner::CheckMaxNrVectors(size_t maxNrAlphas, size_t nrAlphas) const
{
    if(maxNrAlphas && nrAlphas>maxNrAlphas)
    {
        stringstream ss;
        ss << "MonahanPlanner::CheckMaxNrVectors too many alpha vectors "
           << nrAlphas << ">" << maxNrAlphas;
        throw(E(ss.str()));
    }
}